

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O2

void __thiscall w3Interp::Rotl_i32(w3Interp *this)

{
  byte bVar1;
  int32_t iVar2;
  uint32_t *puVar3;
  
  iVar2 = w3Stack::pop_i32(&this->super_w3Stack);
  puVar3 = w3Stack::u32(&this->super_w3Stack);
  bVar1 = (byte)iVar2 & 0x1f;
  *puVar3 = *puVar3 << bVar1 | *puVar3 >> 0x20 - bVar1;
  return;
}

Assistant:

INTERP (Rotl_i32)
{
    const int n = 32;
    const int32_t b = (pop_i32 () & (n - 1));
    uint32_t& r = u32 ();
    uint32_t a = r;
#if _MSC_VER
    r = _rotl (a, b);
#else
    r = ((a << b) | (a >> (n - b)));
#endif
}